

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::TreeEnsembleParameters::Clear(TreeEnsembleParameters *this)

{
  uint32_t cached_has_bits;
  TreeEnsembleParameters *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::Clear
            (&this->nodes_);
  google::protobuf::RepeatedField<double>::Clear(&this->basepredictionvalue_);
  this->numpredictiondimensions_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TreeEnsembleParameters::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.TreeEnsembleParameters)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  nodes_.Clear();
  basepredictionvalue_.Clear();
  numpredictiondimensions_ = uint64_t{0u};
  _internal_metadata_.Clear<std::string>();
}